

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O2

void __thiscall
randomx::AssemblyGeneratorX86::h_CFROUND(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  ostream *poVar1;
  undefined1 *puVar2;
  uint uVar3;
  
  puVar2 = &this->field_0x10;
  poVar1 = std::operator<<((ostream *)puVar2,"\tmov rax, ");
  poVar1 = std::operator<<(poVar1,*(char **)(regR + (ulong)instr->src * 8));
  std::endl<char,std::char_traits<char>>(poVar1);
  uVar3 = 0xd - instr->imm32 & 0x3f;
  if (uVar3 != 0) {
    poVar1 = std::operator<<((ostream *)puVar2,"\trol rax, ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar3);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::operator<<((ostream *)puVar2,"\tand eax, 24576");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)puVar2,"\tor eax, 40896");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)puVar2,"\tpush rax");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)puVar2,"\tldmxcsr dword ptr [rsp]");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)puVar2,"\tpop rax");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void AssemblyGeneratorX86::h_CFROUND(Instruction& instr, int i) {
		asmCode << "\tmov rax, " << regR[instr.src] << std::endl;
		int rotate = (13 - (instr.getImm32() & 63)) & 63;
		if (rotate != 0)
			asmCode << "\trol rax, " << rotate << std::endl;
		asmCode << "\tand eax, 24576" << std::endl;
		asmCode << "\tor eax, 40896" << std::endl;
		asmCode << "\tpush rax" << std::endl;
		asmCode << "\tldmxcsr dword ptr [rsp]" << std::endl;
		asmCode << "\tpop rax" << std::endl;
		tracenop(instr);
	}